

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::copyAppend
          (QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *this,
          X509CertificateExtension *b,X509CertificateExtension *e)

{
  qsizetype *pqVar1;
  X509CertificateExtension *pXVar2;
  long lVar3;
  Data *pDVar4;
  bool bVar5;
  
  if ((b != e) && (b < e)) {
    pXVar2 = (this->
             super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
             ptr;
    do {
      lVar3 = (this->
              super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
              size;
      pDVar4 = (b->oid).d.d;
      pXVar2[lVar3].oid.d.d = pDVar4;
      pXVar2[lVar3].oid.d.ptr = (b->oid).d.ptr;
      pXVar2[lVar3].oid.d.size = (b->oid).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar4 = (b->name).d.d;
      pXVar2[lVar3].name.d.d = pDVar4;
      pXVar2[lVar3].name.d.ptr = (b->name).d.ptr;
      pXVar2[lVar3].name.d.size = (b->name).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVariant::QVariant(&pXVar2[lVar3].value,&b->value);
      bVar5 = b->supported;
      pXVar2[lVar3].critical = b->critical;
      pXVar2[lVar3].supported = bVar5;
      pqVar1 = &(this->
                super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>)
                .size;
      *pqVar1 = *pqVar1 + 1;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }